

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cpp
# Opt level: O2

void __thiscall Server::Private::interrupt(Private *this)

{
  Guard guard;
  Guard local_10;
  
  local_10._mutex = &this->_interruptMutex;
  Mutex::lock(local_10._mutex);
  if (this->_interrupted == false) {
    this->_interrupted = true;
    Mutex::Guard::~Guard(&local_10);
    Socket::Poll::interrupt(&this->_sockets);
  }
  else {
    Mutex::Guard::~Guard(&local_10);
  }
  return;
}

Assistant:

void Server::Private::interrupt()
{
  {
    Mutex::Guard guard(_interruptMutex);
    if (_interrupted)
      return;
    _interrupted = true;
  }
  _sockets.interrupt();
}